

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

size_t script_get_push_size(size_t n)

{
  undefined8 uStack_8;
  
  if (n < 0x4c) {
    uStack_8 = 1;
  }
  else if (n < 0x100) {
    uStack_8 = 2;
  }
  else {
    uStack_8 = (ulong)(0xffff < n) * 2 + 3;
  }
  return uStack_8 + n;
}

Assistant:

static size_t calc_push_opcode_size(size_t n)
{
    if (n < 76)
        return 1;
    else if (n < 256)
        return 2;
    else if (n < 65536)
        return 3;
    return 5;
}